

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marker-index.cc
# Opt level: O2

Node * __thiscall
MarkerIndex::Iterator::insert_splice_boundary(Iterator *this,Point *position,bool is_insertion_end)

{
  int iVar1;
  Node **ppNVar2;
  
  reset(this);
  ppNVar2 = &this->current_node;
LAB_00151823:
  do {
    iVar1 = Point::compare(position,&this->current_node_position);
    if (iVar1 == 0 && !is_insertion_end) {
LAB_0015188a:
      return *ppNVar2;
    }
    if (-1 < iVar1) {
      if ((*ppNVar2)->right == (Node *)0x0) {
        insert_right_child(this,position);
        ppNVar2 = &this->current_node->right;
        goto LAB_0015188a;
      }
      descend_right(this);
      goto LAB_00151823;
    }
    if ((*ppNVar2)->left == (Node *)0x0) {
      insert_left_child(this,position);
      ppNVar2 = &this->current_node->left;
      goto LAB_0015188a;
    }
    descend_left(this);
  } while( true );
}

Assistant:

MarkerIndex::Node *MarkerIndex::Iterator::insert_splice_boundary(const Point &position, bool is_insertion_end) {
  reset();

  while (true) {
    int comparison = position.compare(current_node_position);
    if (comparison == 0 && !is_insertion_end) {
      return current_node;
    } else if (comparison < 0) {
      if (current_node->left) {
        descend_left();
      } else {
        insert_left_child(position);
        return current_node->left;
      }
    } else { // comparison > 0
      if (current_node->right) {
        descend_right();
      } else {
        insert_right_child(position);
        return current_node->right;
      }
    }
  }
}